

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O2

void stackjit::Amd64Backend::andRegToReg
               (CodeGen *codeGen,Registers dest,Registers src,bool is32bits)

{
  undefined3 in_register_00000009;
  Registers local_1b;
  uchar local_1a [2];
  
  if (CONCAT31(in_register_00000009,is32bits) == 0) {
    local_1a[1] = 0x48;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_1a + 1);
  }
  local_1a[0] = '!';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,local_1a);
  local_1b = src << 3 | dest | 0xc0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,&local_1b);
  return;
}

Assistant:

void Amd64Backend::andRegToReg(CodeGen& codeGen, Registers dest, Registers src, bool is32bits) {
	    if (!is32bits) {
	        codeGen.push_back(0x48);
	    }

	    codeGen.push_back(0x21);
	    codeGen.push_back(0xc0 | (Byte)dest | ((Byte)src << 3));
	}